

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tester.h
# Opt level: O2

void __thiscall MemMat<int>::MemMat(MemMat<int> *this,Size *size)

{
  Size SVar1;
  int local_94;
  Size local_90;
  Size local_88;
  Mat_<int> local_80;
  
  cv::Mat_<int>::Mat_(&this->img_);
  cv::Mat_<int>::Mat_(&this->accesses_);
  local_88 = *size;
  cv::Mat_<int>::Mat_(&local_80,&local_88);
  cv::Mat::operator=(&(this->img_).super_Mat,&local_80.super_Mat);
  cv::Mat::~Mat(&local_80.super_Mat);
  local_90 = *size;
  local_94 = 0;
  cv::Mat_<int>::Mat_(&local_80,&local_90,&local_94);
  cv::Mat::operator=(&(this->accesses_).super_Mat,&local_80.super_Mat);
  cv::Mat::~Mat(&local_80.super_Mat);
  SVar1 = *size;
  this->rows = SVar1.height;
  this->cols = SVar1.width;
  return;
}

Assistant:

MemMat(cv::Size size)
    {
        img_ = cv::Mat_<T>(size);
        accesses_ = cv::Mat1i(size, 0);
        rows = size.height;
        cols = size.width;
    }